

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

char * put_font_size(char *n,int size)

{
  int iVar1;
  char *__ptr;
  char *pcVar2;
  int local_3c;
  int nbf;
  char *name;
  char *f;
  char *ptr;
  char *buf;
  int i;
  int size_local;
  char *n_local;
  
  buf._0_4_ = 0;
  local_3c = 1;
  __ptr = strdup(n);
  for (; __ptr[(int)buf] != '\0'; buf._0_4_ = (int)buf + 1) {
    if (__ptr[(int)buf] == ',') {
      local_3c = local_3c + 1;
      __ptr[(int)buf] = '\0';
    }
  }
  pcVar2 = (char *)malloc((long)(local_3c << 8));
  *pcVar2 = '\0';
  buf._0_4_ = 0;
  f = __ptr;
  while (f != (char *)0x0 && 0 < local_3c) {
    for (name = find_best_font(f,size); *name != '\0'; name = name + 1) {
      pcVar2[(int)buf] = *name;
      buf._0_4_ = (int)buf + 1;
    }
    local_3c = local_3c + -1;
    for (; *f != '\0'; f = f + 1) {
    }
    if (local_3c != 0) {
      f = f + 1;
      pcVar2[(int)buf] = ',';
      buf._0_4_ = (int)buf + 1;
    }
    while (iVar1 = isspace((int)*f), iVar1 != 0) {
      f = f + 1;
    }
  }
  pcVar2[(int)buf] = '\0';
  free(__ptr);
  return pcVar2;
}

Assistant:

static char *put_font_size(const char *n, int size)
{
        int i = 0;
        char *buf;
        const char *ptr;
        const char *f;
        char *name;
        int nbf = 1;
        name = strdup(n);
        while (name[i]) {
                if (name[i] == ',') {nbf++; name[i] = '\0';}
                i++;
        }

        buf = (char*) malloc(nbf * 256);
        buf[0] = '\0';
        ptr = name;
        i = 0;
        while (ptr && nbf > 0) {
                f = find_best_font(ptr, size);
                while (*f) {
                        buf[i] = *f;
                        f++; i++;
                }
                nbf--;
                while (*ptr) ptr++;
                if (nbf) {
                        ptr++;
                        buf[i] = ',';
                        i++;
                }
                while(isspace(*ptr)) ptr++;
        }
        buf[i] = '\0';
        free(name);
        return buf;
}